

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetAppBundleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          BundleDirectoryLevel level)

{
  bool bVar1;
  char *pcVar2;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  char *ext;
  undefined1 local_25;
  BundleDirectoryLevel local_24;
  string *psStack_20;
  BundleDirectoryLevel level_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *fpath;
  
  local_25 = 0;
  local_24 = level;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  GetFullName(__return_storage_ptr__,this,config,RuntimeBinaryArtifact);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"BUNDLE_EXTENSION",&local_61);
  pcVar2 = GetProperty(this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_40 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    local_40 = "app";
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_40);
  bVar1 = shouldAddContentLevel(local_24);
  if ((bVar1) && (bVar1 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile), !bVar1)) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/Contents");
    bVar1 = shouldAddFullLevel(local_24);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/MacOS");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetAppBundleDirectory(
  const std::string& config, BundleDirectoryLevel level) const
{
  std::string fpath =
    this->GetFullName(config, cmStateEnums::RuntimeBinaryArtifact);
  fpath += ".";
  const char* ext = this->GetProperty("BUNDLE_EXTENSION");
  if (!ext) {
    ext = "app";
  }
  fpath += ext;
  if (shouldAddContentLevel(level) &&
      !this->Makefile->PlatformIsAppleEmbedded()) {
    fpath += "/Contents";
    if (shouldAddFullLevel(level)) {
      fpath += "/MacOS";
    }
  }
  return fpath;
}